

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O0

nng_err nng_http_server_get_tls(nng_http_server *srv,nng_tls_config **cfg)

{
  nng_tls_config **cfg_local;
  nng_http_server *srv_local;
  
  return NNG_ENOTSUP;
}

Assistant:

nng_err
nng_http_server_get_tls(nng_http_server *srv, nng_tls_config **cfg)
{
#if defined(NNG_SUPP_HTTP) && defined(NNG_SUPP_TLS)
	return (nni_http_server_get_tls(srv, cfg));
#else
	NNI_ARG_UNUSED(srv);
	NNI_ARG_UNUSED(cfg);
	return (NNG_ENOTSUP);
#endif
}